

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_outputs_in_struct(CompilerHLSL *this)

{
  size_t count;
  uint *puVar1;
  __node_base *p_Var2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  bool legacy;
  bool local_71;
  SmallVector<unsigned_int,_8UL> local_70;
  anon_class_24_3_7b2c446a local_38;
  
  local_38.execution = Compiler::get_entry_point((Compiler *)this);
  local_71 = *(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x1f;
  local_38.legacy = &local_71;
  local_38.this = this;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar4 & 0x3f) &
        1) != 0) {
      emit_builtin_outputs_in_struct::anon_class_24_3_7b2c446a::operator()
                (&local_38,(uint32_t)uVar4);
    }
  }
  count = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
          _M_element_count;
  if (count != 0) {
    local_70.super_VectorView<unsigned_int>.ptr = (uint *)&local_70.stack_storage;
    local_70.super_VectorView<unsigned_int>.buffer_size = 0;
    local_70.buffer_capacity = 8;
    SmallVector<unsigned_int,_8UL>::reserve(&local_70,count);
    p_Var2 = &(this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
              _M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      SmallVector<unsigned_int,_8UL>::push_back(&local_70,(uint *)(p_Var2 + 1));
    }
    ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_70.super_VectorView<unsigned_int>.ptr,
               (char *)local_70.super_VectorView<unsigned_int>.ptr +
               local_70.super_VectorView<unsigned_int>.buffer_size * 4);
    puVar1 = local_70.super_VectorView<unsigned_int>.ptr;
    lVar5 = local_70.super_VectorView<unsigned_int>.buffer_size << 2;
    for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 4) {
      emit_builtin_outputs_in_struct::anon_class_24_3_7b2c446a::operator()
                (&local_38,*(uint32_t *)((char *)puVar1 + lVar3));
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector(&local_70);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_outputs_in_struct()
{
	auto &execution = get_entry_point();

	bool legacy = hlsl_options.shader_model <= 30;
	active_output_builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		const char *semantic = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		switch (builtin)
		{
		case BuiltInPosition:
			type = "float4";
			semantic = legacy ? "POSITION" : "SV_Position";
			break;

		case BuiltInSampleMask:
			if (hlsl_options.shader_model < 41 || execution.model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Sample Mask output is only supported in PS 4.1 or higher.");
			type = "uint";
			semantic = "SV_Coverage";
			break;

		case BuiltInFragDepth:
			type = "float";
			if (legacy)
			{
				semantic = "DEPTH";
			}
			else
			{
				if (hlsl_options.shader_model >= 50 && execution.flags.get(ExecutionModeDepthGreater))
					semantic = "SV_DepthGreaterEqual";
				else if (hlsl_options.shader_model >= 50 && execution.flags.get(ExecutionModeDepthLess))
					semantic = "SV_DepthLessEqual";
				else
					semantic = "SV_Depth";
			}
			break;

		case BuiltInClipDistance:
			// HLSL is a bit weird here, use SV_ClipDistance0, SV_ClipDistance1 and so on with vectors.
			for (uint32_t clip = 0; clip < clip_distance_count; clip += 4)
			{
				uint32_t to_declare = clip_distance_count - clip;
				if (to_declare > 4)
					to_declare = 4;

				uint32_t semantic_index = clip / 4;

				static const char *types[] = { "float", "float2", "float3", "float4" };
				statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassOutput), semantic_index,
				          " : SV_ClipDistance", semantic_index, ";");
			}
			break;

		case BuiltInCullDistance:
			// HLSL is a bit weird here, use SV_CullDistance0, SV_CullDistance1 and so on with vectors.
			for (uint32_t cull = 0; cull < cull_distance_count; cull += 4)
			{
				uint32_t to_declare = cull_distance_count - cull;
				if (to_declare > 4)
					to_declare = 4;

				uint32_t semantic_index = cull / 4;

				static const char *types[] = { "float", "float2", "float3", "float4" };
				statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassOutput), semantic_index,
				          " : SV_CullDistance", semantic_index, ";");
			}
			break;

		case BuiltInPointSize:
			// If point_size_compat is enabled, just ignore PointSize.
			// PointSize does not exist in HLSL, but some code bases might want to be able to use these shaders,
			// even if it means working around the missing feature.
			if (hlsl_options.point_size_compat)
				break;
			else
				SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");

		default:
			SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");
			break;
		}

		if (type && semantic)
			statement(type, " ", builtin_to_glsl(builtin, StorageClassOutput), " : ", semantic, ";");
	});
}